

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecsBase.hpp
# Opt level: O3

string * __thiscall
sciplot::GridSpecsBase::repr_abi_cxx11_(string *__return_storage_ptr__,GridSpecsBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_type sVar3;
  pointer pcVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  string show;
  stringstream ss;
  string local_230;
  string local_210;
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  bVar2 = (this->super_ShowSpecsOf<sciplot::GridSpecsBase>).m_show;
  iVar5 = 0x17b425;
  if (bVar2 == false) {
    iVar5 = 0x18c142;
  }
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,iVar5,iVar5 + (bVar2 ^ 1) * 2)
  ;
  iVar5 = std::__cxx11::string::compare((char *)local_1d0);
  sVar3 = (this->m_tics)._M_string_length;
  if (sVar3 == 0 && iVar5 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"unset grid","");
    goto LAB_0014067b;
  }
  if (iVar5 == 0 && sVar3 != 0) {
    std::operator+(__return_storage_ptr__,"set grid no",&this->m_tics);
    goto LAB_0014067b;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"set grid ",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(this->m_tics)._M_dataplus._M_p,(this->m_tics)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  paVar1 = &local_230.field_2;
  pcVar4 = (this->super_DepthSpecsOf<sciplot::GridSpecsBase>).m_depth._M_dataplus._M_p;
  local_230._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar4,
             pcVar4 + (this->super_DepthSpecsOf<sciplot::GridSpecsBase>).m_depth._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (this->m_majortics == true) {
    LineSpecsOf<sciplot::GridSpecsBase>::repr_abi_cxx11_
              (&local_230,&this->super_LineSpecsOf<sciplot::GridSpecsBase>);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_230._M_dataplus._M_p,local_230._M_string_length);
    local_1f0.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
    local_1f0._M_dataplus._M_p = local_230._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
LAB_00140618:
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    LineSpecsOf<sciplot::GridSpecsBase>::repr_abi_cxx11_
              (&local_1f0,&this->super_LineSpecsOf<sciplot::GridSpecsBase>);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,0x18d1ce);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_230.field_2._M_allocated_capacity = *psVar8;
      local_230.field_2._8_8_ = plVar7[3];
      local_230._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar8;
      local_230._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_230._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_230._M_dataplus._M_p,local_230._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_00140618;
  }
  std::__cxx11::stringbuf::str();
  internal::removeExtraWhitespaces(__return_storage_ptr__,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
LAB_0014067b:
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto GridSpecsBase::repr() const -> std::string
{
    const auto show = ShowSpecsOf<GridSpecsBase>::repr();
    const auto visible = show != "no";

    if(m_tics.empty() && !visible)
        return "unset grid";

    if(m_tics.size() && !visible)
        return "set grid no" + m_tics;

    std::stringstream ss;
    ss << "set grid " << m_tics << " ";
    ss << DepthSpecsOf<GridSpecsBase>::repr() << " ";
    if(m_majortics)
        ss << LineSpecsOf<GridSpecsBase>::repr();
    else
        ss << ", " + LineSpecsOf<GridSpecsBase>::repr(); // For minor tics, the preceding comma is needed
    return internal::removeExtraWhitespaces(ss.str());
}